

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

HRESULT Js::ParseableFunctionInfo::MapDeferredReparseError
                  (HRESULT *hrParse,CompileScriptException *se)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *hrParse;
  if (iVar3 != -0x7ff8fff2) {
    if (iVar3 != -0x7999bffc) {
      return 0;
    }
    iVar1 = (se->super_ScriptException).ei.scode;
    iVar2 = -0x7ff8fff2;
    iVar3 = iVar1;
    if (iVar1 < -0x7ff5ffe4) {
      if (((iVar1 != -0x7fffbffc) && (iVar3 = iVar2, iVar1 != -0x7ff8fff2)) &&
         (iVar1 != -0x7ff5fff9)) {
        return 0;
      }
    }
    else if (((iVar1 != -0x7ff5ebe4) && (iVar3 = iVar2, iVar1 != -0x7ff5fc17)) &&
            (iVar3 = iVar1, iVar1 != -0x7ff5ffe4)) {
      return 0;
    }
  }
  *hrParse = 0;
  return iVar3;
}

Assistant:

HRESULT ParseableFunctionInfo::MapDeferredReparseError(HRESULT& hrParse, const CompileScriptException& se)
    {
        HRESULT hrMapped = NO_ERROR;

        switch (hrParse)
        {
        case E_OUTOFMEMORY:
            hrMapped = E_OUTOFMEMORY;
            break;

        case SCRIPT_E_RECORDED:
            switch (se.ei.scode)
            {
            case ERRnoMemory:
            case E_OUTOFMEMORY:
            case VBSERR_OutOfMemory:
                hrMapped = E_OUTOFMEMORY;
                break;

            case VBSERR_OutOfStack:
                hrMapped = VBSERR_OutOfStack;
                break;

            case JSERR_AsmJsCompileError:
                hrMapped = JSERR_AsmJsCompileError;
                break;

            case E_ABORT:
                hrMapped = E_ABORT;
                break;
            }
        }

        if (FAILED(hrMapped))
        {
            // If we have mapped error, clear hrParse. We'll throw error from hrMapped.
            hrParse = NO_ERROR;
        }

        return hrMapped;
    }